

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntryNode.cpp
# Opt level: O2

bool __thiscall EntryNode::removeForkPredecessor(EntryNode *this,ForkNode *forkNode)

{
  size_type sVar1;
  bool bVar2;
  ForkNode *local_28;
  EntryNode *local_20;
  
  if (forkNode == (ForkNode *)0x0) {
    bVar2 = false;
  }
  else {
    local_28 = forkNode;
    std::
    _Rb_tree<ForkNode_*,_ForkNode_*,_std::_Identity<ForkNode_*>,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_>
    ::erase(&(this->forkPredecessors_)._M_t,&local_28);
    local_20 = this;
    sVar1 = std::
            _Rb_tree<EntryNode_*,_EntryNode_*,_std::_Identity<EntryNode_*>,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_>
            ::erase(&(local_28->forkSuccessors_)._M_t,&local_20);
    bVar2 = sVar1 != 0;
  }
  return bVar2;
}

Assistant:

bool EntryNode::removeForkPredecessor(ForkNode *forkNode) {
    if (!forkNode) {
        return false;
    }
    forkPredecessors_.erase(forkNode);
    return forkNode->forkSuccessors_.erase(this);
}